

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall Js::FunctionBody::UpdateEntryPointsOnDebugReparse(FunctionBody *this)

{
  undefined2 uVar1;
  undefined8 *puVar2;
  ScriptFunctionType *pSVar3;
  byte bVar4;
  int iVar5;
  FunctionEntryPointInfo *entryPoint;
  JavascriptMethod entryPoint_00;
  void *pvVar6;
  FunctionBody *this_00;
  long lVar7;
  
  this_00 = this;
  entryPoint = GetDefaultFunctionEntryPointInfo(this);
  entryPoint_00 =
       FunctionProxy::GetDirectEntryPoint
                 ((FunctionProxy *)this_00,(ProxyEntryPointInfo *)entryPoint);
  uVar1 = *(undefined2 *)&(this->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45;
  pvVar6 = FunctionProxy::GetAuxPtr((FunctionProxy *)this,FunctionObjectTypeList);
  bVar4 = (byte)((ushort)uVar1 >> 8);
  if (pvVar6 != (void *)0x0) {
    iVar5 = *(int *)((long)pvVar6 + 0x10);
    if (0 < iVar5) {
      lVar7 = 0;
      do {
        puVar2 = *(undefined8 **)(*(long *)((long)pvVar6 + 8) + lVar7 * 8);
        if ((((ulong)puVar2 & 1) == 0 && puVar2 != (undefined8 *)0x0) &&
           ((ScriptFunctionType *)*puVar2 != (ScriptFunctionType *)0x0)) {
          ScriptFunctionType::ChangeEntryPoint
                    ((ScriptFunctionType *)*puVar2,(ProxyEntryPointInfo *)entryPoint,entryPoint_00,
                     (bool)(bVar4 >> 1 & 1));
          iVar5 = *(int *)((long)pvVar6 + 0x10);
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < iVar5);
    }
  }
  pSVar3 = (this->super_ParseableFunctionInfo).super_FunctionProxy.deferredPrototypeType.ptr;
  if (pSVar3 != (ScriptFunctionType *)0x0) {
    ScriptFunctionType::ChangeEntryPoint
              (pSVar3,(ProxyEntryPointInfo *)entryPoint,entryPoint_00,(bool)(bVar4 >> 1 & 1));
  }
  pSVar3 = (this->super_ParseableFunctionInfo).super_FunctionProxy.undeferredFunctionType.ptr;
  if (pSVar3 != (ScriptFunctionType *)0x0) {
    ScriptFunctionType::ChangeEntryPoint
              (pSVar3,(ProxyEntryPointInfo *)entryPoint,entryPoint_00,(bool)(bVar4 >> 1 & 1));
    return;
  }
  return;
}

Assistant:

void FunctionBody::UpdateEntryPointsOnDebugReparse()
    {
        // Update all function types associated with this function body. Note that we can't rely on updating
        // types pointed to by function objects, because the type may evolve to one that is not currently referenced.

        ProxyEntryPointInfo * entryPointInfo = this->GetDefaultFunctionEntryPointInfo();
        JavascriptMethod newEntryPoint = this->GetDirectEntryPoint(entryPointInfo);
        bool isAsmJS = this->GetIsAsmjsMode();

        auto updateOneType = [&](ScriptFunctionType* functionType) {
            // Note that the ScriptFunctionType method will handle cross-site thunks correctly.
            functionType->ChangeEntryPoint(entryPointInfo, newEntryPoint, isAsmJS);
        };

        this->MapFunctionObjectTypes(updateOneType);
    }